

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,Address *out_align)

{
  uint uVar1;
  Location loc;
  bool bVar2;
  Result RVar3;
  char *s;
  undefined8 in_R8;
  undefined8 in_R9;
  string_view sVar4;
  Token token;
  
  bVar2 = PeekMatch(this,AlignEqNat);
  if (bVar2) {
    Consume(&token,this);
    sVar4 = Token::text(&token);
    s = sVar4.data_;
    RVar3 = ParseInt64(s,s + sVar4.size_,out_align,UnsignedOnly);
    if (RVar3.enum_ == Error) {
      loc.filename.data_._4_4_ = token.loc.filename.data_._4_4_;
      loc.filename.data_._0_4_ = token.loc.filename.data_._0_4_;
      loc.filename.size_._0_4_ = (undefined4)token.loc.filename.size_;
      loc.filename.size_._4_4_ = token.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = token.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = token.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = token.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = token.loc.field_1._12_4_;
      Error(this,loc,"invalid alignment \"%.*s\"",sVar4.size_ & 0xffffffff,s,in_R8,in_R9);
    }
    uVar1 = (uint)*out_align - 1;
    if (((uint)*out_align ^ uVar1) <= uVar1) {
      Error(this,0x1aebc4);
    }
  }
  else {
    *out_align = 0xffffffffffffffff;
  }
  return bVar2;
}

Assistant:

bool WastParser::ParseAlignOpt(Address* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    string_view sv = token.text();
    if (Failed(ParseInt64(sv.begin(), sv.end(), out_align,
                          ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}